

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

size_t __thiscall adios2::VariableNT::SelectionSize(VariableNT *this)

{
  __type _Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  string type;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  VariableBase *in_stack_fffffffffffffcc0;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [36];
  undefined4 local_8c;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [40];
  size_t local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to VariableNT::SelectionSize",&local_31);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_fffffffffffffcc0,
             (string *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  adios2::ToString_abi_cxx11_((DataType)local_68);
  GetType<std::__cxx11::string>();
  _Var1 = std::operator==(in_stack_fffffffffffffc20,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  std::__cxx11::string::~string(local_88);
  if (_Var1) {
    local_8 = adios2::core::Variable<std::__cxx11::string>::SelectionSize();
  }
  else {
    GetType<char>();
    _Var1 = std::operator==(in_stack_fffffffffffffc20,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    std::__cxx11::string::~string(local_b0);
    if (_Var1) {
      local_8 = adios2::core::Variable<char>::SelectionSize();
    }
    else {
      GetType<signed_char>();
      _Var1 = std::operator==(in_stack_fffffffffffffc20,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      std::__cxx11::string::~string(local_d0);
      if (_Var1) {
        local_8 = adios2::core::Variable<signed_char>::SelectionSize();
      }
      else {
        GetType<short>();
        _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        std::__cxx11::string::~string(local_f0);
        if (_Var1) {
          local_8 = adios2::core::Variable<short>::SelectionSize();
        }
        else {
          GetType<int>();
          bVar2 = std::operator==(in_stack_fffffffffffffc20,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
          std::__cxx11::string::~string(local_110);
          if ((bVar2 & 1) == 0) {
            GetType<long>();
            _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18)
                                   );
            std::__cxx11::string::~string(local_130);
            if (_Var1) {
              local_8 = adios2::core::Variable<long>::SelectionSize();
            }
            else {
              GetType<unsigned_char>();
              _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffc1f,
                                                  in_stack_fffffffffffffc18));
              std::__cxx11::string::~string(local_150);
              if (_Var1) {
                local_8 = adios2::core::Variable<unsigned_char>::SelectionSize();
              }
              else {
                GetType<unsigned_short>();
                _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffc1f,
                                                    in_stack_fffffffffffffc18));
                std::__cxx11::string::~string(local_170);
                if (_Var1) {
                  local_8 = adios2::core::Variable<unsigned_short>::SelectionSize();
                }
                else {
                  GetType<unsigned_int>();
                  _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffc1f,
                                                      in_stack_fffffffffffffc18));
                  std::__cxx11::string::~string(local_190);
                  if (_Var1) {
                    local_8 = adios2::core::Variable<unsigned_int>::SelectionSize();
                  }
                  else {
                    GetType<unsigned_long>();
                    _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffc1f,
                                                        in_stack_fffffffffffffc18));
                    std::__cxx11::string::~string(local_1b0);
                    if (_Var1) {
                      local_8 = adios2::core::Variable<unsigned_long>::SelectionSize();
                    }
                    else {
                      GetType<float>();
                      bVar2 = std::operator==(in_stack_fffffffffffffc20,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffc1f,
                                                          in_stack_fffffffffffffc18));
                      std::__cxx11::string::~string(local_1d0);
                      if ((bVar2 & 1) == 0) {
                        GetType<double>();
                        bVar3 = std::operator==(in_stack_fffffffffffffc20,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffc1f,
                                                            in_stack_fffffffffffffc18));
                        std::__cxx11::string::~string(local_1f0);
                        if ((bVar3 & 1) == 0) {
                          GetType<long_double>();
                          _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffc1f,
                                                             in_stack_fffffffffffffc18));
                          std::__cxx11::string::~string(local_210);
                          if (_Var1) {
                            local_8 = adios2::core::Variable<long_double>::SelectionSize();
                          }
                          else {
                            GetType<std::complex<float>>();
                            _Var1 = std::operator==(in_stack_fffffffffffffc20,
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffc1f,
                                                             in_stack_fffffffffffffc18));
                            std::__cxx11::string::~string(local_230);
                            if (_Var1) {
                              local_8 = adios2::core::Variable<std::complex<float>>::SelectionSize()
                              ;
                            }
                            else {
                              GetType<std::complex<double>>();
                              bVar4 = std::operator==(in_stack_fffffffffffffc20,
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffc1f,
                                                             in_stack_fffffffffffffc18));
                              std::__cxx11::string::~string(local_250);
                              if ((bVar4 & 1) == 0) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_270,"bindings::CXX11",&local_271)
                                ;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_298,"VariableNT",&local_299);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_2c0,"SelectionSize",&local_2c1);
                                std::operator+((char *)CONCAT17(bVar3,in_stack_fffffffffffffc48),
                                               in_stack_fffffffffffffc40);
                                helper::Throw<std::runtime_error>
                                          (in_stack_fffffffffffffc60,
                                           (string *)CONCAT17(bVar2,in_stack_fffffffffffffc58),
                                           in_stack_fffffffffffffc50,
                                           (string *)CONCAT17(bVar3,in_stack_fffffffffffffc48),
                                           (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
                                std::__cxx11::string::~string(local_2e8);
                                std::__cxx11::string::~string(local_2c0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                                std::__cxx11::string::~string(local_298);
                                std::allocator<char>::~allocator((allocator<char> *)&local_299);
                                std::__cxx11::string::~string(local_270);
                                std::allocator<char>::~allocator((allocator<char> *)&local_271);
                                local_8 = 0;
                              }
                              else {
                                local_8 = adios2::core::Variable<std::complex<double>>::
                                          SelectionSize();
                              }
                            }
                          }
                        }
                        else {
                          local_8 = adios2::core::Variable<double>::SelectionSize();
                        }
                      }
                      else {
                        local_8 = adios2::core::Variable<float>::SelectionSize();
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            local_8 = adios2::core::Variable<int>::SelectionSize();
          }
        }
      }
    }
  }
  local_8c = 1;
  std::__cxx11::string::~string(local_68);
  return local_8;
}

Assistant:

size_t VariableNT::SelectionSize() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::SelectionSize");
    auto type = ToString(m_Variable->m_Type);
#define declare_type(T)                                                                            \
    if (type == GetType<T>())                                                                      \
    {                                                                                              \
        return reinterpret_cast<core::Variable<T> *>(m_Variable)->SelectionSize();                 \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "SelectionSize",
                                      "invalid data type " + type);
    return 0;
}